

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O0

cell * references::scheme::proc_add(cell *__return_storage_ptr__,cells *c)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  long n_00;
  string local_58;
  __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
  local_38;
  __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
  local_30;
  __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
  local_28;
  cellit i;
  long n;
  cells *c_local;
  
  std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::operator[](c,0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  i._M_current = (cell *)atol(pcVar2);
  local_30._M_current =
       (cell *)std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::
               begin(c);
  local_28 = __gnu_cxx::
             __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
             ::operator+(&local_30,1);
  while( true ) {
    local_38._M_current =
         (cell *)std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::
                 end(c);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
    ::operator->(&local_28);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    lVar3 = atol(pcVar2);
    i._M_current = (cell *)((long)&(i._M_current)->type + lVar3);
    __gnu_cxx::
    __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
    ::operator++(&local_28);
  }
  str_abi_cxx11_(&local_58,(scheme *)i._M_current,n_00);
  cell::cell(__return_storage_ptr__,Number,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

cell proc_add(const cells & c)
{
	long n(atol(c[0].val.c_str()));
	for (cellit i = c.begin() + 1; i != c.end(); ++i) n += atol(i->val.c_str());
	return cell(Number, str(n));
}